

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::
lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_erase(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,size_t element_idx)

{
  pointer peVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  uint in_EAX;
  __off64_t *in_R8;
  size_t in_R9;
  
  peVar1 = (this->m_elements).
           super__Vector_base<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (this->m_lru_end)._M_node;
  p_Var3 = peVar1[element_idx].m_lru_position._M_node;
  if (p_Var3 != p_Var2->_M_prev) {
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
              (&this->m_lru_list,(int)p_Var2,(__off64_t *)&this->m_lru_list,(int)p_Var3,in_R8,in_R9,
               in_EAX);
  }
  (this->m_lru_end)._M_node = ((this->m_lru_end)._M_node)->_M_prev;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::erase(&(this->m_keyed_elements)._M_h,
          (const_iterator)
          peVar1[element_idx].m_keyed_position.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
          ._M_cur);
  this->m_used_size = this->m_used_size - 1;
  return;
}

Assistant:

auto do_erase(size_t element_idx) -> void
    {
        element& e = m_elements[element_idx];

        if (e.m_lru_position != std::prev(m_lru_end))
        {
            m_lru_list.splice(m_lru_end, m_lru_list, e.m_lru_position);
        }
        --m_lru_end;

        m_keyed_elements.erase(e.m_keyed_position);

        --m_used_size;
    }